

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * bitor(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_Token *pCVar1;
  _Bool _Var2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Node *pCVar5;
  C_Token *start;
  C_Token *tok_local;
  C_Token **local_38;
  
  tok_local = tok;
  local_38 = rest;
  pCVar3 = bitxor(parser,&tok_local,tok);
  while( true ) {
    pCVar1 = tok_local;
    _Var2 = C_equal(tok_local,"|");
    if (!_Var2) break;
    pCVar4 = bitxor(parser,&tok_local,pCVar1->next);
    pCVar5 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar5->kind = ND_BITOR;
    pCVar5->tok = pCVar1;
    pCVar5->lhs = pCVar3;
    pCVar5->rhs = pCVar4;
    pCVar3 = pCVar5;
  }
  *local_38 = pCVar1;
  return pCVar3;
}

Assistant:

static C_Node *bitor(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = bitxor(parser, &tok, tok);
  while (C_equal(tok, "|")) {
    C_Token *start = tok;
    node = new_binary(parser, ND_BITOR, node, bitxor(parser, &tok, tok->next), start);
  }
  *rest = tok;
  return node;
}